

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ConcatNDLayerParams::SerializeWithCachedSizes
          (ConcatNDLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  int64 iVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ConcatNDLayerParams *this_local;
  
  iVar2 = axis(this);
  if (iVar2 != 0) {
    iVar2 = axis(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(1,iVar2,output);
  }
  bVar1 = interleave(this);
  if (bVar1) {
    bVar1 = interleave(this);
    google::protobuf::internal::WireFormatLite::WriteBool(2,bVar1,output);
  }
  return;
}

Assistant:

void ConcatNDLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ConcatNDLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->axis(), output);
  }

  // bool interleave = 2;
  if (this->interleave() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->interleave(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ConcatNDLayerParams)
}